

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteString
          (EpsCopyOutputStream *this,uint32_t num,Cord *s,uint8_t *ptr)

{
  byte *pbVar1;
  uint8_t *puVar2;
  uint uVar3;
  LogMessageFatal LStack_28;
  
  pbVar1 = EnsureSpace(this,ptr);
  if (pbVar1 < this->end_) {
    uVar3 = num * 8 + 2;
    while( true ) {
      if (uVar3 < 0x80) break;
      *pbVar1 = (byte)uVar3 | 0x80;
      uVar3 = uVar3 >> 7;
      pbVar1 = pbVar1 + 1;
    }
    *pbVar1 = (byte)uVar3;
    puVar2 = WriteCordOutline(this,s,pbVar1 + 1);
    return puVar2;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
             ,0x355,"ptr < end_");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
}

Assistant:

uint8_t* WriteString(uint32_t num, const absl::Cord& s, uint8_t* ptr) {
    ptr = EnsureSpace(ptr);
    ptr = WriteTag(num, 2, ptr);
    return WriteCordOutline(s, ptr);
  }